

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_node
          (NodeLoader *this,instance_node__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> *pIVar4;
  UniqueId instantiatedNodeUniqueId;
  InstanceNode *instanceNode;
  UniqueId instanceNodeUniqueId;
  allocator<char> local_79;
  UniqueId local_78;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> *local_58;
  UniqueId local_50;
  long *local_38 [2];
  long local_28 [2];
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,NODE,false);
  local_78.mClassId = pUVar3->mClassId;
  local_78._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_78.mObjectId = pUVar3->mObjectId;
  local_78.mFileId = pUVar3->mFileId;
  IFilePartLoader::createUniqueId
            (&local_50,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_NODE);
  pIVar4 = (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> *)operator_new(0x58);
  (pIVar4->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>).mUniqueId.mFileId =
       local_50.mFileId;
  (pIVar4->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>).mUniqueId.mClassId =
       local_50.mClassId;
  *(undefined4 *)
   &(pIVar4->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>).mUniqueId.field_0x4 =
       local_50._4_4_;
  (pIVar4->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>).mUniqueId.mObjectId =
       local_50.mObjectId;
  (pIVar4->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>).super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_009b0318;
  (pIVar4->mName)._M_dataplus._M_p = (pointer)&(pIVar4->mName).field_2;
  (pIVar4->mName)._M_string_length = 0;
  (pIVar4->mName).field_2._M_local_buf[0] = '\0';
  (pIVar4->mInstanciatedObjectId).mClassId = local_78.mClassId;
  *(undefined4 *)&(pIVar4->mInstanciatedObjectId).field_0x4 = local_78._4_4_;
  (pIVar4->mInstanciatedObjectId).mObjectId = local_78.mObjectId;
  (pIVar4->mInstanciatedObjectId).mFileId = local_78.mFileId;
  local_58 = pIVar4;
  if (attributeData->name != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,attributeData->name,&local_79);
    std::__cxx11::string::_M_assign((string *)&pIVar4->mName);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>_*>::
  append(&(pNVar1->mInstanceNodes).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>_*>
         ,&local_58);
  COLLADAFW::UniqueId::~UniqueId(&local_50);
  COLLADAFW::UniqueId::~UniqueId(&local_78);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_node( const instance_node__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedNodeUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Node::ID() );

        COLLADAFW::UniqueId instanceNodeUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceNode::ID() );
		COLLADAFW::InstanceNode* instanceNode = FW_NEW COLLADAFW::InstanceNode(instanceNodeUniqueId,instantiatedNodeUniqueId);
		if( attributeData.name )
			instanceNode->setName( attributeData.name );
		currentNode->getInstanceNodes().append(instanceNode);

		return true;
	}